

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeIntegerAffinity(Mem *pMem)

{
  double dVar1;
  long lVar2;
  
  if ((pMem->flags & 0x20) == 0) {
    dVar1 = (pMem->u).r;
    if (-9.223372036854775e+18 <= dVar1) {
      lVar2 = 0x7fffffffffffffff;
      if (dVar1 <= 9.223372036854775e+18) {
        lVar2 = (long)dVar1;
      }
    }
    else {
      lVar2 = -0x8000000000000000;
    }
    if (0xfffffffffffffffd < lVar2 + 0x7fffffffffffffffU || dVar1 != (double)lVar2) {
      return;
    }
    (pMem->u).i = lVar2;
  }
  pMem->flags = pMem->flags & 0xf240 | 4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeIntegerAffinity(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->flags & (MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  if( pMem->flags & MEM_IntReal ){
    MemSetTypeFlag(pMem, MEM_Int);
  }else{
    i64 ix = sqlite3RealToI64(pMem->u.r);

    /* Only mark the value as an integer if
    **
    **    (1) the round-trip conversion real->int->real is a no-op, and
    **    (2) The integer is neither the largest nor the smallest
    **        possible integer (ticket #3922)
    **
    ** The second and third terms in the following conditional enforces
    ** the second condition under the assumption that addition overflow causes
    ** values to wrap around.
    */
    if( pMem->u.r==ix && ix>SMALLEST_INT64 && ix<LARGEST_INT64 ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }
  }
}